

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.h
# Opt level: O2

cmCommand * __thiscall
cmTargetIncludeDirectoriesCommand::Clone(cmTargetIncludeDirectoriesCommand *this)

{
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(0x58);
  cmTargetIncludeDirectoriesCommand((cmTargetIncludeDirectoriesCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmTargetIncludeDirectoriesCommand; }